

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall bloaty::Bloaty::AddSourceMapFilename(Bloaty *this,string *filename)

{
  string_view format;
  mapped_type *this_00;
  ulong in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  string sourcemap_filename;
  string sourcemap_build_id;
  size_t delimiter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff28;
  int line;
  string local_c8 [16];
  Arg *in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  key_type *in_stack_ffffffffffffff58;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff60;
  Arg local_78;
  undefined1 local_38 [32];
  long local_18;
  ulong local_10;
  
  local_10 = in_RSI;
  local_18 = std::__cxx11::string::find((char)in_RSI,0x3d);
  if (local_18 == -1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_RDI,in_stack_ffffffffffffff28);
    absl::substitute_internal::Arg::Arg<std::allocator<char>>(&local_78,in_stack_ffffffffffffff18);
    line = (int)((ulong)local_38 >> 0x20);
    format._M_str = (char *)in_stack_ffffffffffffff58;
    format._M_len = in_stack_ffffffffffffff50;
    absl::Substitute_abi_cxx11_(format,in_stack_ffffffffffffff48);
    std::__cxx11::string::c_str();
    Throw((char *)in_RDI,line);
  }
  std::__cxx11::string::substr((ulong)&stack0xffffffffffffff58,local_10);
  std::__cxx11::string::substr((ulong)local_c8,local_10);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::__cxx11::string::operator=((string *)this_00,local_c8);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
  return;
}

Assistant:

void Bloaty::AddSourceMapFilename(const std::string& filename) {
  std::size_t delimiter = filename.find('=');
  if (delimiter == std::string::npos) {
    THROWF("Source map filename '$0' must have a build id and file name "
           "separated by '='",
           filename);
  }
  std::string sourcemap_build_id = filename.substr(0, delimiter);
  std::string sourcemap_filename = filename.substr(delimiter + 1);
  sourcemap_files_[sourcemap_build_id] = sourcemap_filename;
}